

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O3

void __thiscall
BmsParseInvalidCharAsBarException::BmsParseInvalidCharAsBarException
          (BmsParseInvalidCharAsBarException *this,uint line,string *str)

{
  pointer pcVar1;
  
  (this->super_BmsParseInvalidCharException).super_BmsParseException.line_ = line;
  (this->super_BmsParseInvalidCharException).super_BmsParseException.super_BmsException.
  _vptr_BmsException = (_func_int **)&PTR___cxa_pure_virtual_00144270;
  (this->super_BmsParseInvalidCharException).str_._M_dataplus._M_p =
       (pointer)&(this->super_BmsParseInvalidCharException).str_.field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_BmsParseInvalidCharException).str_,pcVar1,
             pcVar1 + str->_M_string_length);
  (this->super_BmsParseInvalidCharException).super_BmsParseException.super_BmsException.
  _vptr_BmsException = (_func_int **)&PTR_Message_abi_cxx11__00143ce0;
  return;
}

Assistant:

BmsParseInvalidCharAsBarException::BmsParseInvalidCharAsBarException( unsigned int line, const std::string& str ) :
BmsParseInvalidCharException( line, str )
{
}